

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::GenTypeNativePtr
          (string *__return_storage_ptr__,CppGenerator *this,string *type,FieldDef *field,
          bool is_constructor)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  allocator<char> local_85 [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string *ptr_type;
  FieldDef *pFStack_28;
  bool is_constructor_local;
  FieldDef *field_local;
  string *type_local;
  CppGenerator *this_local;
  
  ptr_type._7_1_ = is_constructor;
  pFStack_28 = field;
  field_local = (FieldDef *)type;
  type_local = (string *)this;
  this_local = (CppGenerator *)__return_storage_ptr__;
  local_38 = PtrType_abi_cxx11_(this,field);
  bVar1 = std::operator!=(local_38,"naked");
  if (bVar1) {
    bVar1 = std::operator!=(local_38,"default_ptr_type");
    if (bVar1) {
      local_a8 = local_38;
    }
    else {
      local_a8 = &(this->opts_).super_IDLOptions.cpp_object_api_pointer_type;
    }
    std::operator+(&local_78,local_a8,"<");
    std::operator+(&local_58,&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field_local)
    ;
    std::operator+(__return_storage_ptr__,&local_58,">");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else if ((ptr_type._7_1_ & 1) == 0) {
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field_local,
                   " *");
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_85)
    ;
    std::allocator<char>::~allocator(local_85);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeNativePtr(const std::string &type, const FieldDef *field,
                               bool is_constructor) {
    auto &ptr_type = PtrType(field);
    if (ptr_type != "naked") {
      return (ptr_type != "default_ptr_type"
                  ? ptr_type
                  : opts_.cpp_object_api_pointer_type) +
             "<" + type + ">";
    } else if (is_constructor) {
      return "";
    } else {
      return type + " *";
    }
  }